

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O2

void nes_set_chip_option_fds(NESAPU_INF *info,UINT32 NesOptions)

{
  UINT8 CurOpt;
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = 10;
  iVar2 = 2;
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) break;
    NES_FDS_SetOption(info->chip_fds,uVar1 - 9,(uint)((NesOptions >> (uVar1 & 0x1f) & 1) != 0));
    uVar1 = uVar1 + 1;
  }
  iVar2 = NES_FDS_GetOption(info->chip_fds,2);
  info->fds_disable = (UINT8)iVar2;
  return;
}

Assistant:

static void nes_set_chip_option_fds(NESAPU_INF* info, UINT32 NesOptions)
{
	UINT8 CurOpt;
	
	// FDS options
	// I skip the Cutoff frequency here, since it's not a boolean value.
	for (CurOpt = 10; CurOpt < 12; CurOpt ++)
		NES_FDS_SetOption(info->chip_fds, CurOpt-10+1, (NesOptions >> CurOpt) & 0x01);
	info->fds_disable = NES_FDS_GetOption(info->chip_fds, FDS_OPT_WRITE_PROTECT);
	
	return;
}